

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

AllocateResult __thiscall
capnp::_::BuilderArena::allocate(BuilderArena *this,SegmentWordCount amount)

{
  MessageBuilder *pMVar1;
  ArrayPtr<capnp::word> content;
  AllocateResult AVar2;
  uint uVar3;
  int iVar4;
  BuilderArena *pBVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  SegmentBuilder *result;
  word *attempt;
  word *local_68;
  Id<unsigned_int,_capnp::_::Segment> local_5c;
  BuilderArena *local_58;
  ArrayPtr<const_capnp::word> local_50;
  SegmentWordCount local_3c;
  undefined1 auStack_38 [4];
  SegmentWordCount actualSize;
  ArrayPtr<capnp::word> ptr;
  SegmentWordCount amount_local;
  BuilderArena *this_local;
  word *local_10;
  
  ptr.size_._4_4_ = amount;
  pBVar5 = SegmentBuilder::getArena(&this->segment0);
  if (pBVar5 == (BuilderArena *)0x0) {
    pMVar1 = this->message;
    uVar3 = unbound<unsigned_int>(ptr.size_._4_4_);
    iVar4 = (*pMVar1->_vptr_MessageBuilder[2])(pMVar1,(ulong)uVar3);
    _auStack_38 = (word *)CONCAT44(extraout_var,iVar4);
    local_50 = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)auStack_38);
    local_3c = verifySegment(local_50);
    kj::dtor<capnp::_::SegmentBuilder>(&this->segment0);
    local_58 = this;
    kj::Id<unsigned_int,_capnp::_::Segment>::Id(&local_5c,0);
    local_68 = kj::ArrayPtr<capnp::word>::begin((ArrayPtr<capnp::word> *)auStack_38);
    attempt = (word *)&this->dummyLimiter;
    kj::
    ctor<capnp::_::SegmentBuilder,capnp::_::BuilderArena*,kj::Id<unsigned_int,capnp::_::Segment>,capnp::word*,unsigned_int&,capnp::_::ReadLimiter*>
              (&this->segment0,&local_58,&local_5c,&local_68,&local_3c,(ReadLimiter **)&attempt);
    this->segmentWithSpace = &this->segment0;
    this_local = (BuilderArena *)&this->segment0;
    local_10 = SegmentBuilder::allocate(&this->segment0,ptr.size_._4_4_);
  }
  else if ((this->segmentWithSpace == (SegmentBuilder *)0x0) ||
          (local_10 = SegmentBuilder::allocate(this->segmentWithSpace,ptr.size_._4_4_),
          local_10 == (word *)0x0)) {
    pMVar1 = this->message;
    uVar3 = unbound<unsigned_int>(ptr.size_._4_4_);
    iVar4 = (*pMVar1->_vptr_MessageBuilder[2])(pMVar1,(ulong)uVar3);
    content.ptr._4_4_ = extraout_var_00;
    content.ptr._0_4_ = iVar4;
    content.size_ = extraout_RDX;
    this_local = (BuilderArena *)addSegmentInternal<capnp::word>(this,content);
    this->segmentWithSpace = (SegmentBuilder *)this_local;
    local_10 = SegmentBuilder::allocate((SegmentBuilder *)this_local,ptr.size_._4_4_);
  }
  else {
    this_local = (BuilderArena *)this->segmentWithSpace;
  }
  AVar2.words = local_10;
  AVar2.segment = (SegmentBuilder *)this_local;
  return AVar2;
}

Assistant:

BuilderArena::AllocateResult BuilderArena::allocate(SegmentWordCount amount) {
  if (segment0.getArena() == nullptr) {
    // We're allocating the first segment.
    kj::ArrayPtr<word> ptr = message->allocateSegment(unbound(amount / WORDS));
    auto actualSize = verifySegment(ptr);

    // Re-allocate segment0 in-place.  This is a bit of a hack, but we have not returned any
    // pointers to this segment yet, so it should be fine.
    kj::dtor(segment0);
    kj::ctor(segment0, this, SegmentId(0), ptr.begin(), actualSize, &this->dummyLimiter);

    segmentWithSpace = &segment0;
    return AllocateResult { &segment0, segment0.allocate(amount) };
  } else {
    if (segmentWithSpace != nullptr) {
      // Check if there is space in an existing segment.
      // TODO(perf):  Check for available space in more than just the last segment.  We don't
      //   want this to be O(n), though, so we'll need to maintain some sort of table.  Complicating
      //   matters, we want SegmentBuilders::allocate() to be fast, so we can't update any such
      //   table when allocation actually happens.  Instead, we could have a priority queue based
      //   on the last-known available size, and then re-check the size when we pop segments off it
      //   and shove them to the back of the queue if they have become too small.
      word* attempt = segmentWithSpace->allocate(amount);
      if (attempt != nullptr) {
        return AllocateResult { segmentWithSpace, attempt };
      }
    }

    // Need to allocate a new segment.
    SegmentBuilder* result = addSegmentInternal(message->allocateSegment(unbound(amount / WORDS)));

    // Check this new segment first the next time we need to allocate.
    segmentWithSpace = result;

    // Allocating from the new segment is guaranteed to succeed since we made it big enough.
    return AllocateResult { result, result->allocate(amount) };
  }
}